

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall
ON_3dmAnnotationSettings::Write(ON_3dmAnnotationSettings *this,ON_BinaryArchive *file)

{
  ON_BinaryArchive *pOVar1;
  bool b;
  int iVar2;
  ON_UUID local_40;
  double local_30;
  double d;
  uint textalign;
  int iStack_1c;
  bool rc;
  uint i;
  int minor_version;
  ON_BinaryArchive *file_local;
  ON_3dmAnnotationSettings *this_local;
  
  _i = file;
  file_local = (ON_BinaryArchive *)this;
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  iStack_1c = 2;
  if (0x3b < iVar2) {
    iStack_1c = 4;
  }
  d._7_1_ = ON_BinaryArchive::Write3dmChunkVersion(_i,1,iStack_1c);
  if ((bool)d._7_1_) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,1.0);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_textheight);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_dimexe);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_dimexo);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_arrowlength);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_arrowwidth);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,this->m_centermark);
  }
  textalign = (uint)this->m_dimunits;
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,textalign);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,this->m_arrowtype);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,this->m_angularunits);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,this->m_lengthformat);
  }
  if ((bool)d._7_1_ != false) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,this->m_angleformat);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion(_i);
  d._0_4_ = 2;
  if (iVar2 < 3) {
    d._0_4_ = 0;
  }
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,d._0_4_);
  }
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteInt(_i,this->m_resolution);
  }
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteString(_i,&this->m_facename);
  }
  local_30 = WorldViewTextScale(this);
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,local_30);
  }
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteChar(_i,this->m_b_V5_EnableAnnotationScaling);
  }
  local_30 = WorldViewHatchScale(this);
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteDouble(_i,local_30);
  }
  if ((d._7_1_ & 1) != 0) {
    d._7_1_ = ON_BinaryArchive::WriteChar(_i,this->m_bEnableHatchScaling);
  }
  if (2 < iStack_1c) {
    if ((d._7_1_ & 1) != 0) {
      d._7_1_ = ON_BinaryArchive::WriteChar(_i,this->m_bEnableModelSpaceAnnotationScaling);
    }
    if ((d._7_1_ & 1) != 0) {
      d._7_1_ = ON_BinaryArchive::WriteChar(_i,this->m_bEnableLayoutSpaceAnnotationScaling);
    }
  }
  pOVar1 = _i;
  if (3 < iStack_1c) {
    if ((d._7_1_ & 1) != 0) {
      b = UseDimensionLayer(this);
      d._7_1_ = ON_BinaryArchive::WriteBool(pOVar1,b);
    }
    pOVar1 = _i;
    if ((d._7_1_ & 1) != 0) {
      local_40 = DimensionLayerId(this);
      d._7_1_ = ON_BinaryArchive::WriteUuid(pOVar1,&local_40);
    }
  }
  return (bool)(d._7_1_ & 1);
}

Assistant:

bool ON_3dmAnnotationSettings::Write( ON_BinaryArchive& file ) const
{
  int minor_version
    = file.Archive3dmVersion() >= 60
    ? 4
    : 2;

  unsigned int i;
  bool rc = file.Write3dmChunkVersion(1, minor_version);
  // March 22, 2010 - Global DimScale abandoned and moved into DimStyles, so now
  // in older files, the dimscale values are multiplied into the DimStyle lengths and
  // DimScale is written as 1.0

  // March 2017 Add
  /*
    unsigned char m_b_V5_EnableAnnotationScaling = 1;

  // [Lowell 3-28-2013] New fields for V6
  unsigned char m_bEnableModelSpaceAnnotationScaling = 1;
  unsigned char m_bEnableLayoutSpaceAnnotationScaling = 1;
  */
  if (rc) rc = file.WriteDouble(1.0);

  if (rc) rc = file.WriteDouble(m_textheight);
  if (rc) rc = file.WriteDouble(m_dimexe);
  if (rc) rc = file.WriteDouble(m_dimexo);
  if (rc) rc = file.WriteDouble(m_arrowlength);
  if (rc) rc = file.WriteDouble(m_arrowwidth);
  if (rc) rc = file.WriteDouble(m_centermark);

  i = static_cast<unsigned int>(m_dimunits);
  if (rc) rc = file.WriteInt( i );
  if (rc) rc = file.WriteInt( m_arrowtype );
  if (rc) rc = file.WriteInt( m_angularunits );
  if (rc) rc = file.WriteInt( m_lengthformat );
  if (rc) rc = file.WriteInt( m_angleformat );

  const unsigned int textalign 
    = (file.Archive3dmVersion() <= 2)
    ? 0
    : 2;
  if (rc) rc = file.WriteInt( textalign );

  if (rc) rc = file.WriteInt( m_resolution );

  if (rc) rc = file.WriteString( m_facename );

  // Added 25 August 2010 chunk version 1.1
  double d = WorldViewTextScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_b_V5_EnableAnnotationScaling);

  // Added 14 January 2011 chunk version 1.2
  d = WorldViewHatchScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_bEnableHatchScaling);

  // Added 28 March 2013 chunk version 1.3
  if (minor_version >= 3)
  {
    // [Lowell 3-28-2013] New fields for V6
    if (rc) rc = file.WriteChar(m_bEnableModelSpaceAnnotationScaling);
    if (rc) rc = file.WriteChar(m_bEnableLayoutSpaceAnnotationScaling);
  }

  //  Added 17 April 2023 chunk version 1.4
  if (minor_version >= 4)
  {
    if (rc) rc = file.WriteBool(UseDimensionLayer());
    if (rc) rc = file.WriteUuid(DimensionLayerId());
  }

  return rc;
}